

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx512.cpp
# Opt level: O0

void ncnn::quantize_pack4to1
               (float *ptr,char *s8ptr0,char *s8ptr1,char *s8ptr2,char *s8ptr3,Mat *scale_data,
               int elemcount)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  long *in_R9;
  __m128i v0145;
  __m128i v1537;
  __m128i v0426;
  __m128 _v7;
  __m128 _v6;
  __m128 _v5;
  __m128 _v4;
  __m128 _v3;
  __m128 _v2;
  __m128 _v1;
  __m128 _v0;
  int i;
  __m128 _scale;
  float scale;
  int scale_data_size;
  __m128i _v8_1;
  __m128i _v23_s16_1;
  __m128i _v01_s16_1;
  __m128i _v3_i_1;
  __m128i _v2_i_1;
  __m128i _v1_i_1;
  __m128i _v0_i_1;
  __m128 _v3_adj_1;
  __m128 _v2_adj_1;
  __m128 _v1_adj_1;
  __m128 _v0_adj_1;
  __m128 _v3_p5_1;
  __m128 _v2_p5_1;
  __m128 _v1_p5_1;
  __m128 _v0_p5_1;
  __m128 _sign3_1;
  __m128 _sign2_1;
  __m128 _sign1_1;
  __m128 _sign0_1;
  __m128 _signmask_1;
  __m128 _p5_1;
  __m128i _v8;
  __m128i _v23_s16;
  __m128i _v01_s16;
  __m128i _v3_i;
  __m128i _v2_i;
  __m128i _v1_i;
  __m128i _v0_i;
  __m128 _v3_adj;
  __m128 _v2_adj;
  __m128 _v1_adj;
  __m128 _v0_adj;
  __m128 _v3_p5;
  __m128 _v2_p5;
  __m128 _v1_p5;
  __m128 _v0_p5;
  __m128 _sign3;
  __m128 _sign2;
  __m128 _sign1;
  __m128 _sign0;
  __m128 _signmask;
  __m128 _p5;
  __m128i _v8_2;
  __m128i _v01_s16_2;
  __m128i _v1_i_2;
  __m128i _v0_i_2;
  __m128 _v1_adj_2;
  __m128 _v0_adj_2;
  __m128 _v1_p5_2;
  __m128 _v0_p5_2;
  __m128 _sign1_2;
  __m128 _sign0_2;
  __m128 _signmask_2;
  __m128 _p5_2;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  int local_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 *local_1048;
  undefined8 *local_1040;
  undefined8 *local_1038;
  undefined8 *local_1030;
  undefined8 *local_1028;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  float local_f48;
  float fStack_f44;
  float fStack_f40;
  float fStack_f3c;
  float local_f28;
  float fStack_f24;
  float fStack_f20;
  float fStack_f1c;
  float local_f08;
  float fStack_f04;
  float fStack_f00;
  float fStack_efc;
  float local_ee8;
  float fStack_ee4;
  float fStack_ee0;
  float fStack_edc;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  int64_t v;
  __m128 _v;
  __m128i v23;
  __m128i v01;
  __m128i v4567;
  __m128i v0123;
  __m128i v2367;
  
  uVar1 = *(undefined4 *)*in_R9;
  local_1068 = CONCAT44(uVar1,uVar1);
  uStack_1060 = CONCAT44(uVar1,uVar1);
  if (1 < *(int *)((long)in_R9 + 0x2c)) {
    local_1068 = *(undefined8 *)*in_R9;
    uStack_1060 = ((undefined8 *)*in_R9)[1];
  }
  local_106c = 0;
  local_1048 = in_R8;
  local_1040 = in_RCX;
  local_1038 = in_RDX;
  local_1030 = in_RSI;
  local_1028 = in_RDI;
  while( true ) {
    local_e98 = (float)local_1068;
    fStack_e94 = (float)((ulong)local_1068 >> 0x20);
    fStack_e90 = (float)uStack_1060;
    fStack_e8c = (float)((ulong)uStack_1060 >> 0x20);
    if ((int)v0145[1] <= local_106c + 7) break;
    local_e88 = (float)*local_1028;
    fStack_e84 = (float)((ulong)*local_1028 >> 0x20);
    fStack_e80 = (float)local_1028[1];
    fStack_e7c = (float)((ulong)local_1028[1] >> 0x20);
    local_ea8 = (float)local_1028[2];
    fStack_ea4 = (float)((ulong)local_1028[2] >> 0x20);
    fStack_ea0 = (float)local_1028[3];
    fStack_e9c = (float)((ulong)local_1028[3] >> 0x20);
    local_ec8 = (float)local_1028[4];
    fStack_ec4 = (float)((ulong)local_1028[4] >> 0x20);
    fStack_ec0 = (float)local_1028[5];
    fStack_ebc = (float)((ulong)local_1028[5] >> 0x20);
    local_ee8 = (float)local_1028[6];
    fStack_ee4 = (float)((ulong)local_1028[6] >> 0x20);
    fStack_ee0 = (float)local_1028[7];
    fStack_edc = (float)((ulong)local_1028[7] >> 0x20);
    local_f08 = (float)local_1028[8];
    fStack_f04 = (float)((ulong)local_1028[8] >> 0x20);
    fStack_f00 = (float)local_1028[9];
    fStack_efc = (float)((ulong)local_1028[9] >> 0x20);
    local_f28 = (float)local_1028[10];
    fStack_f24 = (float)((ulong)local_1028[10] >> 0x20);
    fStack_f20 = (float)local_1028[0xb];
    fStack_f1c = (float)((ulong)local_1028[0xb] >> 0x20);
    local_f48 = (float)local_1028[0xc];
    fStack_f44 = (float)((ulong)local_1028[0xc] >> 0x20);
    fStack_f40 = (float)local_1028[0xd];
    fStack_f3c = (float)((ulong)local_1028[0xd] >> 0x20);
    local_f68 = (float)local_1028[0xe];
    fStack_f64 = (float)((ulong)local_1028[0xe] >> 0x20);
    fStack_f60 = (float)local_1028[0xf];
    fStack_f5c = (float)((ulong)local_1028[0xf] >> 0x20);
    auVar4 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar4 = vpinsrd_avx(auVar4,0x80000000,2);
    auVar5 = vpinsrd_avx(auVar4,0x80000000,3);
    auVar31._4_4_ = fStack_e84 * fStack_e94;
    auVar31._0_4_ = local_e88 * local_e98;
    auVar31._8_4_ = fStack_e80 * fStack_e90;
    auVar31._12_4_ = fStack_e7c * fStack_e8c;
    auVar4 = vpand_avx(auVar31,auVar5);
    auVar27._4_4_ = fStack_f04 * fStack_e94;
    auVar27._0_4_ = local_f08 * local_e98;
    auVar27._8_4_ = fStack_f00 * fStack_e90;
    auVar27._12_4_ = fStack_efc * fStack_e8c;
    auVar2 = vpand_avx(auVar27,auVar5);
    auVar29._4_4_ = fStack_ec4 * fStack_e94;
    auVar29._0_4_ = local_ec8 * local_e98;
    auVar29._8_4_ = fStack_ec0 * fStack_e90;
    auVar29._12_4_ = fStack_ebc * fStack_e8c;
    auVar3 = vpand_avx(auVar29,auVar5);
    auVar25._4_4_ = fStack_f44 * fStack_e94;
    auVar25._0_4_ = local_f48 * local_e98;
    auVar25._8_4_ = fStack_f40 * fStack_e90;
    auVar25._12_4_ = fStack_f3c * fStack_e8c;
    auVar5 = vpand_avx(auVar25,auVar5);
    auVar17._8_8_ = 0x3f0000003f000000;
    auVar17._0_8_ = 0x3f0000003f000000;
    auVar4 = vpor_avx(auVar17,auVar4);
    auVar16._8_8_ = 0x3f0000003f000000;
    auVar16._0_8_ = 0x3f0000003f000000;
    auVar2 = vpor_avx(auVar16,auVar2);
    auVar15._8_8_ = 0x3f0000003f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar3 = vpor_avx(auVar15,auVar3);
    auVar14._8_8_ = 0x3f0000003f000000;
    auVar14._0_8_ = 0x3f0000003f000000;
    auVar5 = vpor_avx(auVar14,auVar5);
    local_4f8 = auVar4._0_4_;
    fStack_4f4 = auVar4._4_4_;
    fStack_4f0 = auVar4._8_4_;
    fStack_4ec = auVar4._12_4_;
    local_518 = auVar2._0_4_;
    fStack_514 = auVar2._4_4_;
    fStack_510 = auVar2._8_4_;
    fStack_50c = auVar2._12_4_;
    local_538 = auVar3._0_4_;
    fStack_534 = auVar3._4_4_;
    fStack_530 = auVar3._8_4_;
    fStack_52c = auVar3._12_4_;
    local_558 = auVar5._0_4_;
    fStack_554 = auVar5._4_4_;
    fStack_550 = auVar5._8_4_;
    fStack_54c = auVar5._12_4_;
    auVar13._4_4_ = (int)(fStack_e84 * fStack_e94 + fStack_4f4);
    auVar13._0_4_ = (int)(local_e88 * local_e98 + local_4f8);
    auVar13._12_4_ = (int)(fStack_e7c * fStack_e8c + fStack_4ec);
    auVar13._8_4_ = (int)(fStack_e80 * fStack_e90 + fStack_4f0);
    auVar4._4_4_ = (int)(fStack_f04 * fStack_e94 + fStack_514);
    auVar4._0_4_ = (int)(local_f08 * local_e98 + local_518);
    auVar4._12_4_ = (int)(fStack_efc * fStack_e8c + fStack_50c);
    auVar4._8_4_ = (int)(fStack_f00 * fStack_e90 + fStack_510);
    auVar4 = vpackssdw_avx(auVar13,auVar4);
    auVar12._4_4_ = (int)(fStack_ec4 * fStack_e94 + fStack_534);
    auVar12._0_4_ = (int)(local_ec8 * local_e98 + local_538);
    auVar12._12_4_ = (int)(fStack_ebc * fStack_e8c + fStack_52c);
    auVar12._8_4_ = (int)(fStack_ec0 * fStack_e90 + fStack_530);
    auVar11._4_4_ = (int)(fStack_f44 * fStack_e94 + fStack_554);
    auVar11._0_4_ = (int)(local_f48 * local_e98 + local_558);
    auVar11._12_4_ = (int)(fStack_f3c * fStack_e8c + fStack_54c);
    auVar11._8_4_ = (int)(fStack_f40 * fStack_e90 + fStack_550);
    auVar2 = vpackssdw_avx(auVar12,auVar11);
    auVar3 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar3 = vpinsrw_avx(auVar3,0x7f,2);
    auVar3 = vpinsrw_avx(auVar3,0x7f,3);
    auVar3 = vpinsrw_avx(auVar3,0x7f,4);
    auVar3 = vpinsrw_avx(auVar3,0x7f,5);
    auVar3 = vpinsrw_avx(auVar3,0x7f,6);
    auVar3 = vpinsrw_avx(auVar3,0x7f,7);
    auVar3 = vpminsw_avx(auVar4,auVar3);
    auVar4 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar4 = vpinsrw_avx(auVar4,0x7f,2);
    auVar4 = vpinsrw_avx(auVar4,0x7f,3);
    auVar4 = vpinsrw_avx(auVar4,0x7f,4);
    auVar4 = vpinsrw_avx(auVar4,0x7f,5);
    auVar4 = vpinsrw_avx(auVar4,0x7f,6);
    auVar4 = vpinsrw_avx(auVar4,0x7f,7);
    auVar5 = vpminsw_avx(auVar2,auVar4);
    auVar4 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar4 = vpinsrw_avx(auVar4,0xff81,2);
    auVar4 = vpinsrw_avx(auVar4,0xff81,3);
    auVar4 = vpinsrw_avx(auVar4,0xff81,4);
    auVar4 = vpinsrw_avx(auVar4,0xff81,5);
    auVar4 = vpinsrw_avx(auVar4,0xff81,6);
    auVar4 = vpinsrw_avx(auVar4,0xff81,7);
    auVar2 = vpmaxsw_avx(auVar3,auVar4);
    auVar4 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar4 = vpinsrw_avx(auVar4,0xff81,2);
    auVar4 = vpinsrw_avx(auVar4,0xff81,3);
    auVar4 = vpinsrw_avx(auVar4,0xff81,4);
    auVar4 = vpinsrw_avx(auVar4,0xff81,5);
    auVar4 = vpinsrw_avx(auVar4,0xff81,6);
    auVar4 = vpinsrw_avx(auVar4,0xff81,7);
    auVar4 = vpmaxsw_avx(auVar5,auVar4);
    auVar4 = vpacksswb_avx(auVar2,auVar4);
    auVar2 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar2 = vpinsrd_avx(auVar2,0x80000000,2);
    auVar6 = vpinsrd_avx(auVar2,0x80000000,3);
    auVar30._4_4_ = fStack_ea4 * fStack_e94;
    auVar30._0_4_ = local_ea8 * local_e98;
    auVar30._8_4_ = fStack_ea0 * fStack_e90;
    auVar30._12_4_ = fStack_e9c * fStack_e8c;
    auVar2 = vpand_avx(auVar30,auVar6);
    auVar26._4_4_ = fStack_f24 * fStack_e94;
    auVar26._0_4_ = local_f28 * local_e98;
    auVar26._8_4_ = fStack_f20 * fStack_e90;
    auVar26._12_4_ = fStack_f1c * fStack_e8c;
    auVar3 = vpand_avx(auVar26,auVar6);
    auVar28._4_4_ = fStack_ee4 * fStack_e94;
    auVar28._0_4_ = local_ee8 * local_e98;
    auVar28._8_4_ = fStack_ee0 * fStack_e90;
    auVar28._12_4_ = fStack_edc * fStack_e8c;
    auVar5 = vpand_avx(auVar28,auVar6);
    auVar24._4_4_ = fStack_f64 * fStack_e94;
    auVar24._0_4_ = local_f68 * local_e98;
    auVar24._8_4_ = fStack_f60 * fStack_e90;
    auVar24._12_4_ = fStack_f5c * fStack_e8c;
    auVar6 = vpand_avx(auVar24,auVar6);
    auVar10._8_8_ = 0x3f0000003f000000;
    auVar10._0_8_ = 0x3f0000003f000000;
    auVar2 = vpor_avx(auVar10,auVar2);
    auVar9._8_8_ = 0x3f0000003f000000;
    auVar9._0_8_ = 0x3f0000003f000000;
    auVar3 = vpor_avx(auVar9,auVar3);
    auVar8._8_8_ = 0x3f0000003f000000;
    auVar8._0_8_ = 0x3f0000003f000000;
    auVar5 = vpor_avx(auVar8,auVar5);
    auVar7._8_8_ = 0x3f0000003f000000;
    auVar7._0_8_ = 0x3f0000003f000000;
    auVar6 = vpor_avx(auVar7,auVar6);
    local_9f8 = auVar2._0_4_;
    fStack_9f4 = auVar2._4_4_;
    fStack_9f0 = auVar2._8_4_;
    fStack_9ec = auVar2._12_4_;
    local_a18 = auVar3._0_4_;
    fStack_a14 = auVar3._4_4_;
    fStack_a10 = auVar3._8_4_;
    fStack_a0c = auVar3._12_4_;
    local_a38 = auVar5._0_4_;
    fStack_a34 = auVar5._4_4_;
    fStack_a30 = auVar5._8_4_;
    fStack_a2c = auVar5._12_4_;
    local_a58 = auVar6._0_4_;
    fStack_a54 = auVar6._4_4_;
    fStack_a50 = auVar6._8_4_;
    fStack_a4c = auVar6._12_4_;
    auVar6._4_4_ = (int)(fStack_ea4 * fStack_e94 + fStack_9f4);
    auVar6._0_4_ = (int)(local_ea8 * local_e98 + local_9f8);
    auVar6._12_4_ = (int)(fStack_e9c * fStack_e8c + fStack_9ec);
    auVar6._8_4_ = (int)(fStack_ea0 * fStack_e90 + fStack_9f0);
    auVar2._4_4_ = (int)(fStack_f24 * fStack_e94 + fStack_a14);
    auVar2._0_4_ = (int)(local_f28 * local_e98 + local_a18);
    auVar2._12_4_ = (int)(fStack_f1c * fStack_e8c + fStack_a0c);
    auVar2._8_4_ = (int)(fStack_f20 * fStack_e90 + fStack_a10);
    auVar2 = vpackssdw_avx(auVar6,auVar2);
    auVar5._4_4_ = (int)(fStack_ee4 * fStack_e94 + fStack_a34);
    auVar5._0_4_ = (int)(local_ee8 * local_e98 + local_a38);
    auVar5._12_4_ = (int)(fStack_edc * fStack_e8c + fStack_a2c);
    auVar5._8_4_ = (int)(fStack_ee0 * fStack_e90 + fStack_a30);
    auVar3._4_4_ = (int)(fStack_f64 * fStack_e94 + fStack_a54);
    auVar3._0_4_ = (int)(local_f68 * local_e98 + local_a58);
    auVar3._12_4_ = (int)(fStack_f5c * fStack_e8c + fStack_a4c);
    auVar3._8_4_ = (int)(fStack_f60 * fStack_e90 + fStack_a50);
    auVar3 = vpackssdw_avx(auVar5,auVar3);
    auVar5 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar5 = vpinsrw_avx(auVar5,0x7f,2);
    auVar5 = vpinsrw_avx(auVar5,0x7f,3);
    auVar5 = vpinsrw_avx(auVar5,0x7f,4);
    auVar5 = vpinsrw_avx(auVar5,0x7f,5);
    auVar5 = vpinsrw_avx(auVar5,0x7f,6);
    auVar5 = vpinsrw_avx(auVar5,0x7f,7);
    auVar5 = vpminsw_avx(auVar2,auVar5);
    auVar2 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar2 = vpinsrw_avx(auVar2,0x7f,2);
    auVar2 = vpinsrw_avx(auVar2,0x7f,3);
    auVar2 = vpinsrw_avx(auVar2,0x7f,4);
    auVar2 = vpinsrw_avx(auVar2,0x7f,5);
    auVar2 = vpinsrw_avx(auVar2,0x7f,6);
    auVar2 = vpinsrw_avx(auVar2,0x7f,7);
    auVar6 = vpminsw_avx(auVar3,auVar2);
    auVar2 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar2 = vpinsrw_avx(auVar2,0xff81,2);
    auVar2 = vpinsrw_avx(auVar2,0xff81,3);
    auVar2 = vpinsrw_avx(auVar2,0xff81,4);
    auVar2 = vpinsrw_avx(auVar2,0xff81,5);
    auVar2 = vpinsrw_avx(auVar2,0xff81,6);
    auVar2 = vpinsrw_avx(auVar2,0xff81,7);
    auVar3 = vpmaxsw_avx(auVar5,auVar2);
    auVar2 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar2 = vpinsrw_avx(auVar2,0xff81,2);
    auVar2 = vpinsrw_avx(auVar2,0xff81,3);
    auVar2 = vpinsrw_avx(auVar2,0xff81,4);
    auVar2 = vpinsrw_avx(auVar2,0xff81,5);
    auVar2 = vpinsrw_avx(auVar2,0xff81,6);
    auVar2 = vpinsrw_avx(auVar2,0xff81,7);
    auVar2 = vpmaxsw_avx(auVar6,auVar2);
    auVar2 = vpacksswb_avx(auVar3,auVar2);
    auVar3 = vpunpcklbw_avx(auVar4,auVar2);
    auVar4 = vpunpckhbw_avx(auVar4,auVar2);
    auVar2 = vpunpcklwd_avx(auVar3,auVar4);
    auVar4 = vpunpckhwd_avx(auVar3,auVar4);
    auVar3 = vpunpckldq_avx(auVar2,auVar4);
    auVar4 = vpunpckhdq_avx(auVar2,auVar4);
    local_1168 = auVar3._0_8_;
    uStack_1160 = auVar3._8_8_;
    *local_1030 = local_1168;
    *local_1038 = uStack_1160;
    local_1178 = auVar4._0_8_;
    uStack_1170 = auVar4._8_8_;
    *local_1040 = local_1178;
    *local_1048 = uStack_1170;
    local_1028 = local_1028 + 0x10;
    local_1030 = local_1030 + 1;
    local_1038 = local_1038 + 1;
    local_1040 = local_1040 + 1;
    local_1048 = local_1048 + 1;
    local_106c = local_106c + 8;
  }
  for (; local_106c < (int)v0145[1]; local_106c = local_106c + 1) {
    local_f88 = (float)*local_1028;
    fStack_f84 = (float)((ulong)*local_1028 >> 0x20);
    fStack_f80 = (float)local_1028[1];
    fStack_f7c = (float)((ulong)local_1028[1] >> 0x20);
    local_f88 = local_f88 * local_e98;
    fStack_f84 = fStack_f84 * fStack_e94;
    fStack_f80 = fStack_f80 * fStack_e90;
    fStack_f7c = fStack_f7c * fStack_e8c;
    auVar4 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar4 = vpinsrd_avx(auVar4,0x80000000,2);
    auVar2 = vpinsrd_avx(auVar4,0x80000000,3);
    auVar22._4_4_ = fStack_f84;
    auVar22._0_4_ = local_f88;
    auVar22._8_4_ = fStack_f80;
    auVar22._12_4_ = fStack_f7c;
    auVar4 = vpand_avx(auVar22,auVar2);
    auVar23._4_4_ = fStack_f84;
    auVar23._0_4_ = local_f88;
    auVar23._8_4_ = fStack_f80;
    auVar23._12_4_ = fStack_f7c;
    auVar2 = vpand_avx(auVar23,auVar2);
    auVar21._8_8_ = 0x3f0000003f000000;
    auVar21._0_8_ = 0x3f0000003f000000;
    auVar4 = vpor_avx(auVar21,auVar4);
    auVar20._8_8_ = 0x3f0000003f000000;
    auVar20._0_8_ = 0x3f0000003f000000;
    auVar2 = vpor_avx(auVar20,auVar2);
    v._0_4_ = auVar4._0_4_;
    v._4_4_ = auVar4._4_4_;
    _v[0] = auVar4._8_4_;
    _v[1] = auVar4._12_4_;
    local_88 = auVar2._0_4_;
    fStack_84 = auVar2._4_4_;
    fStack_80 = auVar2._8_4_;
    fStack_7c = auVar2._12_4_;
    auVar19._4_4_ = (int)(fStack_f84 + v._4_4_);
    auVar19._0_4_ = (int)(local_f88 + (float)v);
    auVar19._12_4_ = (int)(fStack_f7c + _v[1]);
    auVar19._8_4_ = (int)(fStack_f80 + _v[0]);
    auVar18._4_4_ = (int)(fStack_f84 + fStack_84);
    auVar18._0_4_ = (int)(local_f88 + local_88);
    auVar18._12_4_ = (int)(fStack_f7c + fStack_7c);
    auVar18._8_4_ = (int)(fStack_f80 + fStack_80);
    auVar4 = vpackssdw_avx(auVar19,auVar18);
    auVar2 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar2 = vpinsrw_avx(auVar2,0x7f,2);
    auVar2 = vpinsrw_avx(auVar2,0x7f,3);
    auVar2 = vpinsrw_avx(auVar2,0x7f,4);
    auVar2 = vpinsrw_avx(auVar2,0x7f,5);
    auVar2 = vpinsrw_avx(auVar2,0x7f,6);
    auVar2 = vpinsrw_avx(auVar2,0x7f,7);
    auVar2 = vpminsw_avx(auVar4,auVar2);
    auVar4 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar4 = vpinsrw_avx(auVar4,0xff81,2);
    auVar4 = vpinsrw_avx(auVar4,0xff81,3);
    auVar4 = vpinsrw_avx(auVar4,0xff81,4);
    auVar4 = vpinsrw_avx(auVar4,0xff81,5);
    auVar4 = vpinsrw_avx(auVar4,0xff81,6);
    auVar4 = vpinsrw_avx(auVar4,0xff81,7);
    auVar4 = vpmaxsw_avx(auVar2,auVar4);
    auVar4 = vpacksswb_avx(auVar4,auVar4);
    *(char *)local_1030 = auVar4[4];
    *(char *)local_1038 = auVar4[5];
    *(char *)local_1040 = auVar4[6];
    *(char *)local_1048 = auVar4[7];
    local_1028 = local_1028 + 2;
    local_1030 = (undefined8 *)((long)local_1030 + 1);
    local_1038 = (undefined8 *)((long)local_1038 + 1);
    local_1040 = (undefined8 *)((long)local_1040 + 1);
    local_1048 = (undefined8 *)((long)local_1048 + 1);
  }
  return;
}

Assistant:

static void quantize_pack4to1(const float* ptr, signed char* s8ptr0, signed char* s8ptr1, signed char* s8ptr2, signed char* s8ptr3, const Mat& scale_data, int elemcount)
{
    const int scale_data_size = scale_data.w;

    // NCNN_LOGE("quantize_pack4to1 %d   %d", scale_data_size, elemcount);

    float scale = scale_data[0];
    __m128 _scale = _mm_set1_ps(scale);
    if (scale_data_size > 1)
    {
        _scale = _mm_loadu_ps((const float*)scale_data);
    }

    int i = 0;
    for (; i + 7 < elemcount; i += 8)
    {
        __m128 _v0 = _mm_loadu_ps(ptr);
        __m128 _v1 = _mm_loadu_ps(ptr + 4);
        __m128 _v2 = _mm_loadu_ps(ptr + 8);
        __m128 _v3 = _mm_loadu_ps(ptr + 12);
        __m128 _v4 = _mm_loadu_ps(ptr + 16);
        __m128 _v5 = _mm_loadu_ps(ptr + 20);
        __m128 _v6 = _mm_loadu_ps(ptr + 24);
        __m128 _v7 = _mm_loadu_ps(ptr + 28);
        _v0 = _mm_mul_ps(_v0, _scale);
        _v1 = _mm_mul_ps(_v1, _scale);
        _v2 = _mm_mul_ps(_v2, _scale);
        _v3 = _mm_mul_ps(_v3, _scale);
        _v4 = _mm_mul_ps(_v4, _scale);
        _v5 = _mm_mul_ps(_v5, _scale);
        _v6 = _mm_mul_ps(_v6, _scale);
        _v7 = _mm_mul_ps(_v7, _scale);
        __m128i v0426 = float2int8_sse(_v0, _v4, _v2, _v6);
        __m128i v1537 = float2int8_sse(_v1, _v5, _v3, _v7);
        __m128i v0145 = _mm_unpacklo_epi8(v0426, v1537);
        __m128i v2367 = _mm_unpackhi_epi8(v0426, v1537);
        __m128i v0123 = _mm_unpacklo_epi16(v0145, v2367);
        __m128i v4567 = _mm_unpackhi_epi16(v0145, v2367);
        __m128i v01 = _mm_unpacklo_epi32(v0123, v4567);
        __m128i v23 = _mm_unpackhi_epi32(v0123, v4567);
        _mm_storel_pd((double*)s8ptr0, _mm_castsi128_pd(v01));
        _mm_storeh_pd((double*)s8ptr1, _mm_castsi128_pd(v01));
        _mm_storel_pd((double*)s8ptr2, _mm_castsi128_pd(v23));
        _mm_storeh_pd((double*)s8ptr3, _mm_castsi128_pd(v23));
        ptr += 32;
        s8ptr0 += 8;
        s8ptr1 += 8;
        s8ptr2 += 8;
        s8ptr3 += 8;
    }
    for (; i < elemcount; i++)
    {
        __m128 _v = _mm_loadu_ps(ptr);
        _v = _mm_mul_ps(_v, _scale);
        int64_t v = float2int8_sse(_v, _v);
        s8ptr0[0] = (v >> 32) & 0xff;
        s8ptr1[0] = (v >> 40) & 0xff;
        s8ptr2[0] = (v >> 48) & 0xff;
        s8ptr3[0] = (v >> 56) & 0xff;
        ptr += 4;
        s8ptr0 += 1;
        s8ptr1 += 1;
        s8ptr2 += 1;
        s8ptr3 += 1;
    }
}